

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldscript.c
# Opt level: O0

ObjectUnit * make_ld_objunit(GlobalVars *gv)

{
  uint8_t *d;
  ObjectUnit *n_00;
  long in_RDI;
  ObjectUnit *ou;
  char *n;
  char namebuf [256];
  unsigned_long in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  GlobalVars *in_stack_ffffffffffffff00;
  
  snprintf(&stack0xfffffffffffffef8,0x100,"Linker Script <%s>",scriptname);
  d = (uint8_t *)allocstring(in_stack_fffffffffffffef0);
  n_00 = art_objunit(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,d,in_stack_fffffffffffffee8
                    );
  if (n_00 != (ObjectUnit *)0x0) {
    n_00->flags = n_00->flags | 0x8001;
    addhead((list *)(in_RDI + 0x150),&n_00->n);
  }
  return n_00;
}

Assistant:

static struct ObjectUnit *make_ld_objunit(struct GlobalVars *gv)
/* creates a LinkFile node and a ObjectUnit for symbols defined
   by the linker script */
{
  char namebuf[MAXLEN];
  const char *n;
  struct ObjectUnit *ou;

  snprintf(namebuf,MAXLEN,"Linker Script <%s>",scriptname);
  n = allocstring(namebuf);
  if (ou = art_objunit(gv,n,NULL,0)) {
    ou->flags |= OUF_LINKED | OUF_SCRIPT;
    /*ou->lnkfile->type = ID_OBJECT; @@@ should stay ID_ARTIFICIAL? */
    addhead(&gv->selobjects,&ou->n);
  }
  return ou;
}